

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O0

ParsedFloat *
absl::lts_20240722::strings_internal::ParseFloat<16>
          (ParsedFloat *__return_storage_ptr__,char *begin,char *end,chars_format format_flags)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *exponent_digits_begin;
  bool negative_exponent;
  bool found_exponent;
  char *exponent_begin;
  int post_decimal_digits;
  int zeros_skipped;
  char *begin_zeros;
  int digits_left;
  int pre_decimal_digits;
  bool mantissa_is_inexact;
  ulong uStack_30;
  int exponent_adjustment;
  uint64_t mantissa;
  char *mantissa_begin;
  char *pcStack_18;
  chars_format format_flags_local;
  char *end_local;
  char *begin_local;
  
  mantissa_begin._4_4_ = format_flags;
  pcStack_18 = end;
  end_local = begin;
  ParsedFloat::ParsedFloat(__return_storage_ptr__);
  if ((end_local != pcStack_18) &&
     (bVar1 = lts_20240722::anon_unknown_0::ParseInfinityOrNan
                        (end_local,pcStack_18,__return_storage_ptr__), pcVar5 = pcStack_18, !bVar1))
  {
    mantissa = (uint64_t)end_local;
    while( true ) {
      pcVar6 = end_local;
      bVar1 = false;
      if (end_local < pcStack_18) {
        bVar1 = *end_local == '0';
      }
      if (!bVar1) break;
      end_local = end_local + 1;
    }
    uStack_30 = 0;
    pre_decimal_digits = 0;
    digits_left._3_1_ = 0;
    iVar3 = lts_20240722::anon_unknown_0::MantissaDigitsMax<16>();
    iVar3 = lts_20240722::(anonymous_namespace)::ConsumeDigits<16,unsigned_long>
                      (pcVar6,pcVar5,iVar3,&stack0xffffffffffffffd0,(bool *)((long)&digits_left + 3)
                      );
    end_local = end_local + iVar3;
    iVar4 = lts_20240722::anon_unknown_0::DigitLimit<16>();
    if (iVar3 < iVar4) {
      iVar4 = lts_20240722::anon_unknown_0::MantissaDigitsMax<16>();
      if (iVar4 < iVar3) {
        iVar4 = lts_20240722::anon_unknown_0::MantissaDigitsMax<16>();
        pre_decimal_digits = iVar3 - iVar4;
        begin_zeros._0_4_ = 0;
      }
      else {
        iVar4 = lts_20240722::anon_unknown_0::MantissaDigitsMax<16>();
        begin_zeros._0_4_ = iVar4 - iVar3;
      }
      if ((end_local < pcStack_18) && (*end_local == '.')) {
        pcVar5 = end_local + 1;
        end_local = pcVar5;
        if (uStack_30 == 0) {
          while( true ) {
            bVar1 = false;
            if (end_local < pcStack_18) {
              bVar1 = *end_local == '0';
            }
            if (!bVar1) break;
            end_local = end_local + 1;
          }
          iVar3 = (int)end_local - (int)pcVar5;
          iVar4 = lts_20240722::anon_unknown_0::DigitLimit<16>();
          if (iVar4 <= iVar3) {
            return __return_storage_ptr__;
          }
          pre_decimal_digits = pre_decimal_digits - iVar3;
        }
        iVar3 = lts_20240722::(anonymous_namespace)::ConsumeDigits<16,unsigned_long>
                          (end_local,pcStack_18,(int)begin_zeros,&stack0xffffffffffffffd0,
                           (bool *)((long)&digits_left + 3));
        end_local = end_local + iVar3;
        iVar4 = lts_20240722::anon_unknown_0::DigitLimit<16>();
        if (iVar4 <= iVar3) {
          return __return_storage_ptr__;
        }
        if ((int)begin_zeros < iVar3) {
          iVar3 = (int)begin_zeros;
        }
        pre_decimal_digits = pre_decimal_digits - iVar3;
      }
      pcVar5 = end_local;
      if (((char *)mantissa != end_local) &&
         (((long)end_local - mantissa != 1 || (*(char *)mantissa != '.')))) {
        if ((digits_left._3_1_ & 1) != 0) {
          uStack_30 = uStack_30 | 1;
        }
        __return_storage_ptr__->mantissa = uStack_30;
        __return_storage_ptr__->literal_exponent = 0;
        bVar1 = false;
        bVar2 = lts_20240722::anon_unknown_0::AllowExponent(mantissa_begin._4_4_);
        if (((bVar2) && (end_local < pcStack_18)) &&
           (bVar2 = lts_20240722::anon_unknown_0::IsExponentCharacter<16>(*end_local), bVar2)) {
          bVar2 = false;
          pcVar6 = end_local + 1;
          if ((pcVar6 < pcStack_18) && (*pcVar6 == '-')) {
            bVar2 = true;
            pcVar6 = end_local + 2;
          }
          else if ((pcVar6 < pcStack_18) && (*pcVar6 == '+')) {
            pcVar6 = end_local + 2;
          }
          end_local = pcVar6;
          pcVar6 = end_local;
          iVar3 = lts_20240722::(anonymous_namespace)::ConsumeDigits<10,int>
                            (end_local,pcStack_18,9,&__return_storage_ptr__->literal_exponent,
                             (bool *)0x0);
          end_local = end_local + iVar3;
          if (end_local == pcVar6) {
            bVar1 = false;
            end_local = pcVar5;
          }
          else {
            bVar1 = true;
            if (bVar2) {
              __return_storage_ptr__->literal_exponent = -__return_storage_ptr__->literal_exponent;
            }
          }
        }
        if ((bVar1) ||
           (bVar1 = lts_20240722::anon_unknown_0::RequireExponent(mantissa_begin._4_4_), !bVar1)) {
          __return_storage_ptr__->type = kNumber;
          if (__return_storage_ptr__->mantissa == 0) {
            __return_storage_ptr__->exponent = 0;
          }
          else {
            iVar3 = __return_storage_ptr__->literal_exponent;
            iVar4 = lts_20240722::anon_unknown_0::DigitMagnitude<16>();
            __return_storage_ptr__->exponent = iVar3 + iVar4 * pre_decimal_digits;
          }
          __return_storage_ptr__->end = end_local;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

strings_internal::ParsedFloat ParseFloat(const char* begin, const char* end,
                                         chars_format format_flags) {
  strings_internal::ParsedFloat result;

  // Exit early if we're given an empty range.
  if (begin == end) return result;

  // Handle the infinity and NaN cases.
  if (ParseInfinityOrNan(begin, end, &result)) {
    return result;
  }

  const char* const mantissa_begin = begin;
  while (begin < end && *begin == '0') {
    ++begin;  // skip leading zeros
  }
  uint64_t mantissa = 0;

  int exponent_adjustment = 0;
  bool mantissa_is_inexact = false;
  int pre_decimal_digits = ConsumeDigits<base>(
      begin, end, MantissaDigitsMax<base>(), &mantissa, &mantissa_is_inexact);
  begin += pre_decimal_digits;
  int digits_left;
  if (pre_decimal_digits >= DigitLimit<base>()) {
    // refuse to parse pathological inputs
    return result;
  } else if (pre_decimal_digits > MantissaDigitsMax<base>()) {
    // We dropped some non-fraction digits on the floor.  Adjust our exponent
    // to compensate.
    exponent_adjustment =
        static_cast<int>(pre_decimal_digits - MantissaDigitsMax<base>());
    digits_left = 0;
  } else {
    digits_left =
        static_cast<int>(MantissaDigitsMax<base>() - pre_decimal_digits);
  }
  if (begin < end && *begin == '.') {
    ++begin;
    if (mantissa == 0) {
      // If we haven't seen any nonzero digits yet, keep skipping zeros.  We
      // have to adjust the exponent to reflect the changed place value.
      const char* begin_zeros = begin;
      while (begin < end && *begin == '0') {
        ++begin;
      }
      int zeros_skipped = static_cast<int>(begin - begin_zeros);
      if (zeros_skipped >= DigitLimit<base>()) {
        // refuse to parse pathological inputs
        return result;
      }
      exponent_adjustment -= static_cast<int>(zeros_skipped);
    }
    int post_decimal_digits = ConsumeDigits<base>(
        begin, end, digits_left, &mantissa, &mantissa_is_inexact);
    begin += post_decimal_digits;

    // Since `mantissa` is an integer, each significant digit we read after
    // the decimal point requires an adjustment to the exponent. "1.23e0" will
    // be stored as `mantissa` == 123 and `exponent` == -2 (that is,
    // "123e-2").
    if (post_decimal_digits >= DigitLimit<base>()) {
      // refuse to parse pathological inputs
      return result;
    } else if (post_decimal_digits > digits_left) {
      exponent_adjustment -= digits_left;
    } else {
      exponent_adjustment -= post_decimal_digits;
    }
  }
  // If we've found no mantissa whatsoever, this isn't a number.
  if (mantissa_begin == begin) {
    return result;
  }
  // A bare "." doesn't count as a mantissa either.
  if (begin - mantissa_begin == 1 && *mantissa_begin == '.') {
    return result;
  }

  if (mantissa_is_inexact) {
    // We dropped significant digits on the floor.  Handle this appropriately.
    if (base == 10) {
      // If we truncated significant decimal digits, store the full range of the
      // mantissa for future big integer math for exact rounding.
      result.subrange_begin = mantissa_begin;
      result.subrange_end = begin;
    } else if (base == 16) {
      // If we truncated hex digits, reflect this fact by setting the low
      // ("sticky") bit.  This allows for correct rounding in all cases.
      mantissa |= 1;
    }
  }
  result.mantissa = mantissa;

  const char* const exponent_begin = begin;
  result.literal_exponent = 0;
  bool found_exponent = false;
  if (AllowExponent(format_flags) && begin < end &&
      IsExponentCharacter<base>(*begin)) {
    bool negative_exponent = false;
    ++begin;
    if (begin < end && *begin == '-') {
      negative_exponent = true;
      ++begin;
    } else if (begin < end && *begin == '+') {
      ++begin;
    }
    const char* const exponent_digits_begin = begin;
    // Exponent is always expressed in decimal, even for hexadecimal floats.
    begin += ConsumeDigits<10>(begin, end, kDecimalExponentDigitsMax,
                               &result.literal_exponent, nullptr);
    if (begin == exponent_digits_begin) {
      // there were no digits where we expected an exponent.  We failed to read
      // an exponent and should not consume the 'e' after all.  Rewind 'begin'.
      found_exponent = false;
      begin = exponent_begin;
    } else {
      found_exponent = true;
      if (negative_exponent) {
        result.literal_exponent = -result.literal_exponent;
      }
    }
  }

  if (!found_exponent && RequireExponent(format_flags)) {
    // Provided flags required an exponent, but none was found.  This results
    // in a failure to scan.
    return result;
  }

  // Success!
  result.type = strings_internal::FloatType::kNumber;
  if (result.mantissa > 0) {
    result.exponent = result.literal_exponent +
                      (DigitMagnitude<base>() * exponent_adjustment);
  } else {
    result.exponent = 0;
  }
  result.end = begin;
  return result;
}